

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialiterable.cpp
# Opt level: O0

QVariant * __thiscall QSequentialConstIterator::operator*(QSequentialConstIterator *this)

{
  long lVar1;
  QBaseIterator<QMetaSequence> *in_RDI;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c in_stack_00000020;
  QBaseIterator<QMetaSequence> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QBaseIterator<QMetaSequence>::metaContainer(in_RDI);
  QMetaSequence::valueMetaType((QMetaSequence *)this_00);
  QIterablePrivate::operator*((QMetaType)this,in_stack_00000020);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QVariant *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSequentialConstIterator::operator*() const
{
    return QIterablePrivate::retrieveElement(metaContainer().valueMetaType(), [this](void *dataPtr) {
        metaContainer().valueAtConstIterator(constIterator(), dataPtr);
    });
}